

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O0

void Wln_NtkRetimeTest(char *pFileName,int fSkipSimple,int fVerbose)

{
  void *pData_00;
  Vec_Int_t *p;
  Wln_Ntk_t *local_38;
  Wln_Ntk_t *pNtk;
  void *pData;
  Vec_Int_t *vMoves;
  int fVerbose_local;
  int fSkipSimple_local;
  char *pFileName_local;
  
  pData_00 = Ndr_Read(pFileName);
  if (pData_00 == (void *)0x0) {
    local_38 = (Wln_Ntk_t *)0x0;
  }
  else {
    local_38 = Wln_NtkFromNdr(pData_00);
  }
  if (local_38 == (Wln_Ntk_t *)0x0) {
    printf("Retiming network is not available.\n");
  }
  else {
    Ndr_Delete(pData_00);
    Wln_NtkRetimeCreateDelayInfo(local_38);
    p = Wln_NtkRetime(local_38,fSkipSimple,fVerbose);
    Vec_IntFree(p);
    Wln_NtkFree(local_38);
  }
  return;
}

Assistant:

void Wln_NtkRetimeTest( char * pFileName, int fSkipSimple, int fVerbose )
{
    Vec_Int_t * vMoves;
    void * pData = Ndr_Read( pFileName );
    Wln_Ntk_t * pNtk = pData ? Wln_NtkFromNdr( pData ) : NULL;
    if ( pNtk == NULL ) 
    {
        printf( "Retiming network is not available.\n" );
        return;
    }
    Ndr_Delete( pData );
    Wln_NtkRetimeCreateDelayInfo( pNtk );
    vMoves = Wln_NtkRetime( pNtk, fSkipSimple, fVerbose );
    //Vec_IntPrint( vMoves );
    Vec_IntFree( vMoves );
    Wln_NtkFree( pNtk );
}